

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall google::LogDestination::SetLoggerImpl(LogDestination *this,Logger *logger)

{
  LogDestination *pLVar1;
  
  pLVar1 = (LogDestination *)this->logger_;
  if (pLVar1 != (LogDestination *)logger) {
    if (pLVar1 != this && pLVar1 != (LogDestination *)0x0) {
      (*(pLVar1->fileobject_).super_Logger._vptr_Logger[1])();
    }
    this->logger_ = logger;
  }
  return;
}

Assistant:

void LogDestination::SetLoggerImpl(base::Logger* logger) {
  if (logger_ == logger) {
    // Prevent releasing currently held sink on reset
    return;
  }

  if (logger_ && logger_ != &fileobject_) {
    // Delete user-specified logger set via SetLogger().
    delete logger_;
  }
  logger_ = logger;
}